

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute(archive_read *a,tar *tar,archive_entry *entry,char *key,size_t key_length,
                     size_t value_length,int64_t *unconsumed)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t local_64;
  wchar_t err;
  ssize_t bytes_read;
  char *p;
  long n;
  int64_t t;
  size_t value_length_local;
  size_t key_length_local;
  char *key_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_64 = L'\0';
  t = value_length;
  value_length_local = key_length;
  key_length_local = (size_t)key;
  key_local = (char *)entry;
  entry_local = (archive_entry *)tar;
  tar_local = (tar *)a;
  switch(*key) {
  case 'G':
    if ((4 < key_length) && (*(int *)key == 0x2e554e47)) {
      key_length_local = (size_t)(key + 4);
      value_length_local = key_length - 4;
      if ((value_length_local == 6) &&
         (iVar1 = memcmp((void *)key_length_local,"sparse",6), iVar1 == 0)) {
        *(undefined1 *)&(entry_local->ae_fflags_text).aes_wcs.buffer_length = 1;
      }
      else if ((7 < value_length_local) &&
              (iVar1 = memcmp((void *)key_length_local,"sparse.",7), iVar1 == 0)) {
        *(undefined1 *)&(entry_local->ae_fflags_text).aes_wcs.buffer_length = 1;
        key_length_local = key_length_local + 7;
        value_length_local = value_length_local - 7;
        if ((value_length_local == 9) &&
           (iVar1 = memcmp((void *)key_length_local,"numblocks",9), iVar1 == 0)) {
          (entry_local->ae_fflags_text).aes_utf8.buffer_length = 0xffffffffffffffff;
          (entry_local->ae_fflags_text).aes_wcs.s = (wchar_t *)0xffffffffffffffff;
          *(undefined4 *)&(entry_local->ae_fflags_text).aes_wcs.length = 0;
          *(undefined4 *)((long)&(entry_local->ae_fflags_text).aes_wcs.length + 4) = 0;
        }
        else {
          if ((value_length_local == 6) &&
             (iVar1 = memcmp((void *)key_length_local,"offset",6), iVar1 == 0)) {
            wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
            if (wVar2 != L'\0') {
              return wVar2;
            }
            (entry_local->ae_fflags_text).aes_utf8.buffer_length = n;
            if ((entry_local->ae_fflags_text).aes_wcs.s == (wchar_t *)0xffffffffffffffff) {
              return L'\0';
            }
            wVar2 = gnu_add_sparse_entry
                              ((archive_read *)tar_local,(tar *)entry_local,
                               (entry_local->ae_fflags_text).aes_utf8.buffer_length,
                               (int64_t)(entry_local->ae_fflags_text).aes_wcs.s);
            if (wVar2 == L'\0') {
              (entry_local->ae_fflags_text).aes_utf8.buffer_length = 0xffffffffffffffff;
              (entry_local->ae_fflags_text).aes_wcs.s = (wchar_t *)0xffffffffffffffff;
              return L'\0';
            }
            return L'\xffffffe2';
          }
          if ((value_length_local == 8) && (*(long *)key_length_local == 0x73657479626d756e)) {
            wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
            if (wVar2 != L'\0') {
              return wVar2;
            }
            (entry_local->ae_fflags_text).aes_wcs.s = (wchar_t *)n;
            if ((entry_local->ae_fflags_text).aes_utf8.buffer_length == 0xffffffffffffffff) {
              return L'\0';
            }
            wVar2 = gnu_add_sparse_entry
                              ((archive_read *)tar_local,(tar *)entry_local,
                               (entry_local->ae_fflags_text).aes_utf8.buffer_length,
                               (int64_t)(entry_local->ae_fflags_text).aes_wcs.s);
            if (wVar2 == L'\0') {
              (entry_local->ae_fflags_text).aes_utf8.buffer_length = 0xffffffffffffffff;
              (entry_local->ae_fflags_text).aes_wcs.s = (wchar_t *)0xffffffffffffffff;
              return L'\0';
            }
            return L'\xffffffe2';
          }
          if ((value_length_local == 4) && (*(int *)key_length_local == 0x657a6973)) {
            wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
            if (wVar2 != L'\0') {
              return wVar2;
            }
            (entry_local->ae_fflags_text).aes_mbs.s = (char *)n;
            *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) =
                 *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) | 4;
            return L'\0';
          }
          if ((value_length_local == 3) &&
             (iVar1 = memcmp((void *)key_length_local,"map",3), iVar1 == 0)) {
            *(undefined4 *)&(entry_local->ae_fflags_text).aes_wcs.length = 0;
            *(undefined4 *)((long)&(entry_local->ae_fflags_text).aes_wcs.length + 4) = 1;
            if ((ulong)t < 0x800001) {
              bytes_read = (ssize_t)__archive_read_ahead
                                              ((archive_read *)tar_local,t,
                                               (ssize_t *)&stack0xffffffffffffffa0);
              if ((char *)bytes_read == (char *)0x0) {
                archive_set_error((archive *)tar_local,0x16,
                                  "Truncated archive detected while reading GNU sparse data");
                return L'\xffffffe2';
              }
              wVar2 = gnu_sparse_01_parse((archive_read *)tar_local,(tar *)entry_local,
                                          (char *)bytes_read,t);
              if (wVar2 != L'\0') {
                local_64 = L'\xffffffec';
              }
            }
            else {
              archive_set_error((archive *)tar_local,-1,"Unreasonably large sparse map: %d > %d",
                                t & 0xffffffff,0x800000);
              local_64 = L'\xffffffe7';
            }
            __archive_read_consume((archive_read *)tar_local,t);
            return local_64;
          }
          if ((value_length_local == 5) &&
             (iVar1 = memcmp((void *)key_length_local,"major",5), iVar1 == 0)) {
            wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
            if (wVar2 != L'\0') {
              return wVar2;
            }
            if (n < 0) {
              return L'\0';
            }
            if (10 < n) {
              return L'\0';
            }
            *(int *)&(entry_local->ae_fflags_text).aes_wcs.length = (int)n;
            return L'\0';
          }
          if ((value_length_local == 5) &&
             (iVar1 = memcmp((void *)key_length_local,"minor",5), iVar1 == 0)) {
            wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
            if (wVar2 != L'\0') {
              return wVar2;
            }
            if (n < 0) {
              return L'\0';
            }
            if (10 < n) {
              return L'\0';
            }
            *(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.length + 4) = (int)n;
            return L'\0';
          }
          if ((value_length_local == 4) && (*(int *)key_length_local == 0x656d616e)) {
            if ((ulong)t < 0x100001) {
              local_64 = read_bytes_to_string
                                   ((archive_read *)tar_local,
                                    (archive_string *)&entry_local->ae_stat,t,unconsumed);
            }
            else {
              *unconsumed = t + *unconsumed;
              local_64 = L'\xffffffec';
            }
            return local_64;
          }
          if ((value_length_local == 8) && (*(long *)key_length_local == 0x657a69736c616572)) {
            wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
            if (wVar2 != L'\0') {
              return wVar2;
            }
            *(long *)&entry_local->ae_set = n;
            *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) =
                 *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) | 2;
            return L'\0';
          }
        }
      }
    }
    break;
  case 'L':
    if ((0xb < key_length) && (iVar1 = memcmp(key,"LIBARCHIVE.",0xb), iVar1 == 0)) {
      value_length_local = value_length_local - 0xb;
      key_length_local = key_length_local + 0xb;
      if ((value_length_local == 0xc) &&
         (iVar1 = memcmp((void *)key_length_local,"creationtime",0xc), iVar1 == 0)) {
        wVar2 = pax_attribute_read_time((archive_read *)tar_local,t,&n,(long *)&p,unconsumed);
        if (wVar2 != L'\0') {
          return wVar2;
        }
        archive_entry_set_birthtime((archive_entry *)key_local,n,(long)p);
        return L'\0';
      }
      if ((value_length_local == 0xb) &&
         (iVar1 = memcmp((void *)key_length_local,"symlinktype",0xb), iVar1 == 0)) {
        if ((ulong)t < 0x10) {
          bytes_read = (ssize_t)__archive_read_ahead
                                          ((archive_read *)tar_local,t,
                                           (ssize_t *)&stack0xffffffffffffffa0);
          if ((int *)bytes_read == (int *)0x0) {
            archive_set_error((archive *)tar_local,0x54,
                              "Truncated tar archive detected while reading `symlinktype` attribute"
                             );
            return L'\xffffffe2';
          }
          if ((t == 4) && (*(int *)bytes_read == 0x656c6966)) {
            archive_entry_set_symlink_type((archive_entry *)key_local,L'\x01');
          }
          else if ((t == 3) && (iVar1 = memcmp((void *)bytes_read,"dir",3), iVar1 == 0)) {
            archive_entry_set_symlink_type((archive_entry *)key_local,L'\x02');
          }
          else {
            archive_set_error((archive *)tar_local,-1,"Unrecognized symlink type");
            local_64 = L'\xffffffec';
          }
        }
        else {
          archive_set_error((archive *)tar_local,-1,
                            "symlink type is very long(longest recognized value is 4 bytes, this is %d)"
                            ,t & 0xffffffff);
          local_64 = L'\xffffffec';
        }
        __archive_read_consume((archive_read *)tar_local,t);
        return local_64;
      }
      if ((6 < value_length_local) &&
         (iVar1 = memcmp((void *)key_length_local,"xattr.",6), iVar1 == 0)) {
        value_length_local = value_length_local - 6;
        key_length_local = key_length_local + 6;
        if ((ulong)t < 0x1000001) {
          bytes_read = (ssize_t)__archive_read_ahead
                                          ((archive_read *)tar_local,t,
                                           (ssize_t *)&stack0xffffffffffffffa0);
          if ((char *)bytes_read == (char *)0x0) {
            archive_set_error((archive *)tar_local,0x16,
                              "Truncated archive detected while reading xattr information");
            return L'\xffffffe2';
          }
          wVar2 = pax_attribute_LIBARCHIVE_xattr
                            ((archive_entry *)key_local,(char *)key_length_local,value_length_local,
                             (char *)bytes_read,t);
          if (wVar2 != L'\0') {
            local_64 = L'\xffffffec';
          }
        }
        else {
          local_64 = L'\xffffffec';
        }
        __archive_read_consume((archive_read *)tar_local,t);
        return local_64;
      }
    }
    break;
  case 'R':
    if ((key_length == 0x14) && (iVar1 = memcmp(key,"RHT.security.selinux",0x14), iVar1 == 0)) {
      if ((ulong)t < 0x1000001) {
        bytes_read = (ssize_t)__archive_read_ahead
                                        ((archive_read *)tar_local,t,
                                         (ssize_t *)&stack0xffffffffffffffa0);
        if ((char *)bytes_read == (char *)0x0) {
          archive_set_error((archive *)tar_local,0x16,
                            "Truncated archive detected while reading selinux data");
          return L'\xffffffe2';
        }
        wVar2 = pax_attribute_RHT_security_selinux((archive_entry *)key_local,(char *)bytes_read,t);
        if (wVar2 != L'\0') {
          local_64 = L'\xffffffec';
        }
      }
      else {
        archive_set_error((archive *)tar_local,-1,
                          "Ignoring unreasonably large security.selinux attribute: %d > %d",
                          t & 0xffffffff,0x1000000);
        local_64 = L'\xffffffec';
      }
      __archive_read_consume((archive_read *)tar_local,t);
      return local_64;
    }
    break;
  case 'S':
    if ((7 < key_length) && (iVar1 = memcmp(key,"SCHILY.",7), iVar1 == 0)) {
      value_length_local = value_length_local - 7;
      key_length_local = key_length_local + 7;
      if ((value_length_local == 10) &&
         (iVar1 = memcmp((void *)key_length_local,"acl.access",10), iVar1 == 0)) {
        wVar2 = pax_attribute_SCHILY_acl
                          ((archive_read *)tar_local,(tar *)entry_local,(archive_entry *)key_local,t
                           ,L'Ā');
        return wVar2;
      }
      if ((value_length_local == 0xb) &&
         (iVar1 = memcmp((void *)key_length_local,"acl.default",0xb), iVar1 == 0)) {
        wVar2 = pax_attribute_SCHILY_acl
                          ((archive_read *)tar_local,(tar *)entry_local,(archive_entry *)key_local,t
                           ,L'Ȁ');
        return wVar2;
      }
      if ((value_length_local == 7) &&
         (iVar1 = memcmp((void *)key_length_local,"acl.ace",7), iVar1 == 0)) {
        wVar2 = pax_attribute_SCHILY_acl
                          ((archive_read *)tar_local,(tar *)entry_local,(archive_entry *)key_local,t
                           ,L'㰀');
        return wVar2;
      }
      if ((value_length_local == 8) && (*(long *)key_length_local == 0x726f6a616d766564)) {
        wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
        if (wVar2 != L'\0') {
          return wVar2;
        }
        archive_entry_set_rdevmajor((archive_entry *)key_local,n);
        return L'\0';
      }
      if ((value_length_local == 8) && (*(long *)key_length_local == 0x726f6e696d766564)) {
        wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
        if (wVar2 != L'\0') {
          return wVar2;
        }
        archive_entry_set_rdevminor((archive_entry *)key_local,n);
        return L'\0';
      }
      if ((value_length_local == 6) &&
         (iVar1 = memcmp((void *)key_length_local,"fflags",6), iVar1 == 0)) {
        if ((ulong)t < 0x200) {
          bytes_read = (ssize_t)__archive_read_ahead
                                          ((archive_read *)tar_local,t,
                                           (ssize_t *)&stack0xffffffffffffffa0);
          if ((char *)bytes_read == (char *)0x0) {
            archive_set_error((archive *)tar_local,0x16,
                              "Truncated archive detected while reading SCHILY.fflags");
            return L'\xffffffe2';
          }
          archive_entry_copy_fflags_text_len((archive_entry *)key_local,(char *)bytes_read,t);
          local_64 = L'\0';
        }
        else {
          local_64 = L'\xffffffec';
        }
        __archive_read_consume((archive_read *)tar_local,t);
        return local_64;
      }
      if ((value_length_local == 3) &&
         (iVar1 = memcmp((void *)key_length_local,"dev",3), iVar1 == 0)) {
        wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
        if (wVar2 != L'\0') {
          return wVar2;
        }
        archive_entry_set_dev((archive_entry *)key_local,n);
        return L'\0';
      }
      if ((value_length_local == 3) &&
         (iVar1 = memcmp((void *)key_length_local,"ino",3), iVar1 == 0)) {
        wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
        if (wVar2 != L'\0') {
          return wVar2;
        }
        archive_entry_set_ino((archive_entry *)key_local,n);
        return L'\0';
      }
      if ((value_length_local == 5) &&
         (iVar1 = memcmp((void *)key_length_local,"nlink",5), iVar1 == 0)) {
        wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
        if (wVar2 != L'\0') {
          return wVar2;
        }
        archive_entry_set_nlink((archive_entry *)key_local,(uint)n);
        return L'\0';
      }
      if ((value_length_local == 8) && (*(long *)key_length_local == 0x657a69736c616572)) {
        wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
        if (wVar2 != L'\0') {
          return wVar2;
        }
        (entry_local->ae_fflags_text).aes_mbs.length = n;
        *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) =
             *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) | 8;
        return L'\0';
      }
      if ((6 < value_length_local) &&
         (iVar1 = memcmp((void *)key_length_local,"xattr.",6), iVar1 == 0)) {
        value_length_local = value_length_local - 6;
        key_length_local = key_length_local + 6;
        if ((ulong)t < 0x1000000) {
          bytes_read = (ssize_t)__archive_read_ahead
                                          ((archive_read *)tar_local,t,
                                           (ssize_t *)&stack0xffffffffffffffa0);
          if ((char *)bytes_read == (char *)0x0) {
            archive_set_error((archive *)tar_local,0x16,
                              "Truncated archive detected while reading SCHILY.xattr");
            return L'\xffffffe2';
          }
          wVar2 = pax_attribute_SCHILY_xattr
                            ((archive_entry *)key_local,(char *)key_length_local,value_length_local,
                             (char *)bytes_read,t);
          if (wVar2 != L'\0') {
            local_64 = L'\xffffffec';
          }
        }
        else {
          archive_set_error((archive *)tar_local,-1,"Unreasonably large xattr: %d > %d",
                            t & 0xffffffff,0x1000000);
          local_64 = L'\xffffffec';
        }
        __archive_read_consume((archive_read *)tar_local,t);
        return local_64;
      }
    }
    if ((4 < value_length_local) && (*(int *)key_length_local == 0x2e4e5553)) {
      value_length_local = value_length_local - 4;
      key_length_local = key_length_local + 4;
      if ((value_length_local == 9) &&
         (iVar1 = memcmp((void *)key_length_local,"holesdata",9), iVar1 == 0)) {
        if ((ulong)t < 0x800000) {
          bytes_read = (ssize_t)__archive_read_ahead
                                          ((archive_read *)tar_local,t,
                                           (ssize_t *)&stack0xffffffffffffffa0);
          if ((char *)bytes_read == (char *)0x0) {
            archive_set_error((archive *)tar_local,0x16,
                              "Truncated archive detected while reading SUN.holesdata");
            return L'\xffffffe2';
          }
          local_64 = pax_attribute_SUN_holesdata
                               ((archive_read *)tar_local,(tar *)entry_local,
                                (archive_entry *)key_local,(char *)bytes_read,t);
          if (local_64 < L'\0') {
            archive_set_error((archive *)tar_local,-1,"Parse error: SUN.holesdata");
          }
        }
        else {
          archive_set_error((archive *)tar_local,-1,"Unreasonably large sparse map: %d > %d",
                            t & 0xffffffff,0x800000);
          local_64 = L'\xffffffe7';
        }
        __archive_read_consume((archive_read *)tar_local,t);
        return local_64;
      }
    }
    break;
  case 'a':
    if ((key_length == 5) && (iVar1 = memcmp(key,"atime",5), iVar1 == 0)) {
      wVar2 = pax_attribute_read_time((archive_read *)tar_local,t,&n,(long *)&p,unconsumed);
      if (wVar2 != L'\0') {
        return wVar2;
      }
      archive_entry_set_atime((archive_entry *)key_local,n,(long)p);
      return L'\0';
    }
    break;
  case 'c':
    if ((key_length == 5) && (iVar1 = memcmp(key,"ctime",5), iVar1 == 0)) {
      wVar2 = pax_attribute_read_time((archive_read *)tar_local,t,&n,(long *)&p,unconsumed);
      if (wVar2 != L'\0') {
        return wVar2;
      }
      archive_entry_set_ctime((archive_entry *)key_local,n,(long)p);
      return L'\0';
    }
    if (((value_length_local != 7) ||
        (iVar1 = memcmp((void *)key_length_local,"charset",7), iVar1 != 0)) &&
       (value_length_local == 7)) {
      memcmp((void *)key_length_local,"comment",7);
    }
    break;
  case 'g':
    if ((key_length == 3) && (iVar1 = memcmp(key,"gid",3), iVar1 == 0)) {
      wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
      if (wVar2 != L'\0') {
        return wVar2;
      }
      archive_entry_set_gid((archive_entry *)key_local,n);
      return L'\0';
    }
    if ((value_length_local == 5) &&
       (iVar1 = memcmp((void *)key_length_local,"gname",5), iVar1 == 0)) {
      if ((ulong)t < 0x10001) {
        local_64 = read_bytes_to_string
                             ((archive_read *)tar_local,
                              (archive_string *)&(entry_local->ae_stat).aest_birthtime,t,unconsumed)
        ;
      }
      else {
        *unconsumed = t + *unconsumed;
        local_64 = L'\xffffffec';
      }
      return local_64;
    }
    break;
  case 'h':
    if ((key_length == 10) && (iVar1 = memcmp(key,"hdrcharset",10), iVar1 == 0)) {
      if ((ulong)t < 0x40) {
        bytes_read = (ssize_t)__archive_read_ahead
                                        ((archive_read *)tar_local,t,
                                         (ssize_t *)&stack0xffffffffffffffa0);
        if ((void *)bytes_read == (void *)0x0) {
          archive_set_error((archive *)tar_local,0x54,
                            "Truncated tar archive detected while reading hdrcharset attribute");
          return L'\xffffffe2';
        }
        if ((t == 6) && (iVar1 = memcmp((void *)bytes_read,"BINARY",6), iVar1 == 0)) {
          *(undefined4 *)&(entry_local->ae_stat).aest_devmajor = 0;
          local_64 = L'\0';
        }
        else if ((t == 0x17) &&
                (iVar1 = memcmp((void *)bytes_read,"ISO-IR 10646 2000 UTF-8",0x17), iVar1 == 0)) {
          *(undefined4 *)&(entry_local->ae_stat).aest_devmajor = 1;
          local_64 = L'\0';
        }
        else {
          local_64 = L'\xffffffec';
        }
      }
      else {
        archive_set_error((archive *)tar_local,0x54,
                          "hdrcharset attribute is unreasonably large (%d bytes)",t & 0xffffffff);
        local_64 = L'\xffffffec';
      }
      __archive_read_consume((archive_read *)tar_local,t);
      return local_64;
    }
    break;
  case 'l':
    if ((key_length == 8) && (*(long *)key == 0x687461706b6e696c)) {
      if (value_length < 0x100001) {
        local_64 = read_bytes_to_string(a,&tar->entry_linkpath,value_length,unconsumed);
      }
      else {
        *unconsumed = value_length + *unconsumed;
        local_64 = L'\xffffffec';
      }
      return local_64;
    }
    break;
  case 'm':
    if ((key_length == 5) && (iVar1 = memcmp(key,"mtime",5), iVar1 == 0)) {
      wVar2 = pax_attribute_read_time((archive_read *)tar_local,t,&n,(long *)&p,unconsumed);
      if (wVar2 != L'\0') {
        return wVar2;
      }
      archive_entry_set_mtime((archive_entry *)key_local,n,(long)p);
      return L'\0';
    }
    break;
  case 'p':
    if ((key_length == 4) && (*(int *)key == 0x68746170)) {
      if (value_length < 0x100001) {
        local_64 = read_bytes_to_string(a,&tar->entry_pathname,value_length,unconsumed);
      }
      else {
        *unconsumed = value_length + *unconsumed;
        local_64 = L'\xffffffec';
      }
      return local_64;
    }
    break;
  case 'r':
    break;
  case 's':
    if ((key_length == 4) && (*(int *)key == 0x657a6973)) {
      wVar2 = pax_attribute_read_number(a,value_length,&n);
      if (wVar2 == L'\0') {
        (entry_local->ae_fflags_text).aes_mbs.buffer_length = n;
        *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) =
             *(byte *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 2) | 1;
        return L'\0';
      }
      if (n != 0x7fffffffffffffff) {
        return wVar2;
      }
      (entry_local->ae_stat).aest_devminor = 0;
      archive_set_error((archive *)tar_local,-1,"Tar size attribute overflow");
      return L'\xffffffe2';
    }
    break;
  case 'u':
    if ((key_length == 3) && (iVar1 = memcmp(key,"uid",3), iVar1 == 0)) {
      wVar2 = pax_attribute_read_number((archive_read *)tar_local,t,&n);
      if (wVar2 != L'\0') {
        return wVar2;
      }
      archive_entry_set_uid((archive_entry *)key_local,n);
      return L'\0';
    }
    if ((value_length_local == 5) &&
       (iVar1 = memcmp((void *)key_length_local,"uname",5), iVar1 == 0)) {
      if ((ulong)t < 0x10001) {
        local_64 = read_bytes_to_string
                             ((archive_read *)tar_local,
                              (archive_string *)&(entry_local->ae_stat).aest_ctime_nsec,t,unconsumed
                             );
      }
      else {
        *unconsumed = t + *unconsumed;
        local_64 = L'\xffffffec';
      }
      return local_64;
    }
  }
  __archive_read_consume((archive_read *)tar_local,t);
  return L'\0';
}

Assistant:

static int
pax_attribute(struct archive_read *a, struct tar *tar, struct archive_entry *entry,
	      const char *key, size_t key_length, size_t value_length, int64_t *unconsumed)
{
	int64_t t;
	long n;
	const char *p;
	ssize_t bytes_read;
	int err = ARCHIVE_OK;

	switch (key[0]) {
	case 'G':
		/* GNU.* extensions */
		if (key_length > 4 && memcmp(key, "GNU.", 4) == 0) {
			key += 4;
			key_length -= 4;

			/* GNU.sparse marks the existence of GNU sparse information */
			if (key_length == 6 && memcmp(key, "sparse", 6) == 0) {
				tar->sparse_gnu_attributes_seen = 1;
			}

			/* GNU.sparse.* extensions */
			else if (key_length > 7 && memcmp(key, "sparse.", 7) == 0) {
				tar->sparse_gnu_attributes_seen = 1;
				key += 7;
				key_length -= 7;

				/* GNU "0.0" sparse pax format. */
				if (key_length == 9 && memcmp(key, "numblocks", 9) == 0) {
					/* GNU.sparse.numblocks */
					tar->sparse_offset = -1;
					tar->sparse_numbytes = -1;
					tar->sparse_gnu_major = 0;
					tar->sparse_gnu_minor = 0;
				}
				else if (key_length == 6 && memcmp(key, "offset", 6) == 0) {
					/* GNU.sparse.offset */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->sparse_offset = t;
						if (tar->sparse_numbytes != -1) {
							if (gnu_add_sparse_entry(a, tar,
									 tar->sparse_offset, tar->sparse_numbytes)
							    != ARCHIVE_OK)
								return (ARCHIVE_FATAL);
							tar->sparse_offset = -1;
							tar->sparse_numbytes = -1;
						}
					}
					return (err);
				}
				else if (key_length == 8 && memcmp(key, "numbytes", 8) == 0) {
					/* GNU.sparse.numbytes */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->sparse_numbytes = t;
						if (tar->sparse_offset != -1) {
							if (gnu_add_sparse_entry(a, tar,
									 tar->sparse_offset, tar->sparse_numbytes)
							    != ARCHIVE_OK)
								return (ARCHIVE_FATAL);
							tar->sparse_offset = -1;
							tar->sparse_numbytes = -1;
						}
					}
					return (err);
				}
				else if (key_length == 4 && memcmp(key, "size", 4) == 0) {
					/* GNU.sparse.size */
					/* This is either the size of stored entry OR the size of data on disk,
					 * depending on which GNU sparse format version is in use.
					 * Since pax attributes can be in any order, we may not actually
					 * know at this point how to interpret this. */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->GNU_sparse_size = t;
						tar->size_fields |= TAR_SIZE_GNU_SPARSE_SIZE;
					}
					return (err);
				}

				/* GNU "0.1" sparse pax format. */
				else if (key_length == 3 && memcmp(key, "map", 3) == 0) {
					/* GNU.sparse.map */
					tar->sparse_gnu_major = 0;
					tar->sparse_gnu_minor = 1;
					if (value_length > sparse_map_limit) {
						archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
								  "Unreasonably large sparse map: %d > %d",
								  (int)value_length, (int)sparse_map_limit);
						err = ARCHIVE_FAILED;
					} else {
						p = __archive_read_ahead(a, value_length, &bytes_read);
						if (p == NULL) {
							archive_set_error(&a->archive, EINVAL,
									  "Truncated archive"
									  " detected while reading GNU sparse data");
							return (ARCHIVE_FATAL);
						}
						if (gnu_sparse_01_parse(a, tar, p, value_length) != ARCHIVE_OK) {
							err = ARCHIVE_WARN;
						}
					}
					__archive_read_consume(a, value_length);
					return (err);
				}

				/* GNU "1.0" sparse pax format */
				else if (key_length == 5 && memcmp(key, "major", 5) == 0) {
					/* GNU.sparse.major */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK
					    && t >= 0
					    && t <= 10) {
						tar->sparse_gnu_major = (int)t;
					}
					return (err);
				}
				else if (key_length == 5 && memcmp(key, "minor", 5) == 0) {
					/* GNU.sparse.minor */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK
					    && t >= 0
					    && t <= 10) {
						tar->sparse_gnu_minor = (int)t;
					}
					return (err);
				}
				else if (key_length == 4 && memcmp(key, "name", 4) == 0) {
					/* GNU.sparse.name */
					/*
					 * The real filename; when storing sparse
					 * files, GNU tar puts a synthesized name into
					 * the regular 'path' attribute in an attempt
					 * to limit confusion. ;-)
					 */
					if (value_length > pathname_limit) {
						*unconsumed += value_length;
						err = ARCHIVE_WARN;
					} else {
						err = read_bytes_to_string(a, &(tar->entry_pathname_override),
									   value_length, unconsumed);
					}
					return (err);
				}
				else if (key_length == 8 && memcmp(key, "realsize", 8) == 0) {
					/* GNU.sparse.realsize = size of file on disk */
					if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
						tar->GNU_sparse_realsize = t;
						tar->size_fields |= TAR_SIZE_GNU_SPARSE_REALSIZE;
					}
					return (err);
				}
			}
		}
		break;
	case 'L':
		/* LIBARCHIVE extensions */
		if (key_length > 11 && memcmp(key, "LIBARCHIVE.", 11) == 0) {
			key_length -= 11;
			key += 11;

			/* TODO: Handle arbitrary extended attributes... */
			/*
			  if (strcmp(key, "LIBARCHIVE.xxxxxxx") == 0)
				  archive_entry_set_xxxxxx(entry, value);
			*/
			if (key_length == 12 && memcmp(key, "creationtime", 12) == 0) {
				/* LIBARCHIVE.creationtime */
				if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
					archive_entry_set_birthtime(entry, t, n);
				}
				return (err);
			}
			else if (key_length == 11 && memcmp(key, "symlinktype", 11) == 0) {
				/* LIBARCHIVE.symlinktype */
				if (value_length < 16) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
								  "Truncated tar archive "
								  "detected while reading `symlinktype` attribute");
						return (ARCHIVE_FATAL);
					}
					if (value_length == 4 && memcmp(p, "file", 4) == 0) {
						archive_entry_set_symlink_type(entry,
									       AE_SYMLINK_TYPE_FILE);
					} else if (value_length == 3 && memcmp(p, "dir", 3) == 0) {
							archive_entry_set_symlink_type(entry,
										       AE_SYMLINK_TYPE_DIRECTORY);
					} else {
						archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
								  "Unrecognized symlink type");
						err = ARCHIVE_WARN;
					}
				} else {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "symlink type is very long"
							  "(longest recognized value is 4 bytes, this is %d)",
							  (int)value_length);
					err = ARCHIVE_WARN;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
			else if (key_length > 6 && memcmp(key, "xattr.", 6) == 0) {
				key_length -= 6;
				key += 6;
				if (value_length > xattr_limit) {
					err = ARCHIVE_WARN;
				} else {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading xattr information");
						return (ARCHIVE_FATAL);
					}
					if (pax_attribute_LIBARCHIVE_xattr(entry, key, key_length, p, value_length)) {
						/* TODO: Unable to parse xattr */
						err = ARCHIVE_WARN;
					}
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
		}
		break;
	case 'R':
		/* GNU tar uses RHT.security header to store SELinux xattrs
		 * SCHILY.xattr.security.selinux == RHT.security.selinux */
		if (key_length == 20 && memcmp(key, "RHT.security.selinux", 20) == 0) {
			if (value_length > xattr_limit) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring unreasonably large security.selinux attribute:"
						  " %d > %d",
						  (int)value_length, (int)xattr_limit);
				/* TODO: Should this be FAILED instead? */
				err = ARCHIVE_WARN;
			} else {
				p = __archive_read_ahead(a, value_length, &bytes_read);
				if (p == NULL) {
					archive_set_error(&a->archive, EINVAL,
							  "Truncated archive"
							  " detected while reading selinux data");
					return (ARCHIVE_FATAL);
				}
				if (pax_attribute_RHT_security_selinux(entry, p, value_length)) {
					/* TODO: Unable to parse xattr */
					err = ARCHIVE_WARN;
				}
			}
			__archive_read_consume(a, value_length);
			return (err);
		}
		break;
	case 'S':
		/* SCHILY.* extensions used by "star" archiver */
		if (key_length > 7 && memcmp(key, "SCHILY.", 7) == 0) {
			key_length -= 7;
			key += 7;

			if (key_length == 10 && memcmp(key, "acl.access", 10) == 0) {
				err = pax_attribute_SCHILY_acl(a, tar, entry, value_length,
						      ARCHIVE_ENTRY_ACL_TYPE_ACCESS);
				// TODO: Mark mode as set
				return (err);
			}
			else if (key_length == 11 && memcmp(key, "acl.default", 11) == 0) {
				err = pax_attribute_SCHILY_acl(a, tar, entry, value_length,
						      ARCHIVE_ENTRY_ACL_TYPE_DEFAULT);
				return (err);
			}
			else if (key_length == 7 && memcmp(key, "acl.ace", 7) == 0) {
				err = pax_attribute_SCHILY_acl(a, tar, entry, value_length,
						      ARCHIVE_ENTRY_ACL_TYPE_NFS4);
				// TODO: Mark mode as set
				return (err);
			}
			else if (key_length == 8 && memcmp(key, "devmajor", 8) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_rdevmajor(entry, (dev_t)t);
				}
				return (err);
			}
			else if (key_length == 8 && memcmp(key, "devminor", 8) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_rdevminor(entry, (dev_t)t);
				}
				return (err);
			}
			else if (key_length == 6 && memcmp(key, "fflags", 6) == 0) {
				if (value_length < fflags_limit) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						/* Truncated archive */
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading SCHILY.fflags");
						return (ARCHIVE_FATAL);
					}
					archive_entry_copy_fflags_text_len(entry, p, value_length);
					err = ARCHIVE_OK;
				} else {
					/* Overlong fflags field */
					err = ARCHIVE_WARN;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
			else if (key_length == 3 && memcmp(key, "dev", 3) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_dev(entry, (dev_t)t);
				}
				return (err);
			}
			else if (key_length == 3 && memcmp(key, "ino", 3) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_ino(entry, t);
				}
				return (err);
			}
			else if (key_length == 5 && memcmp(key, "nlink", 5) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					archive_entry_set_nlink(entry, (unsigned int)t);
				}
				return (err);
			}
			else if (key_length == 8 && memcmp(key, "realsize", 8) == 0) {
				if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
					tar->SCHILY_sparse_realsize = t;
					tar->size_fields |= TAR_SIZE_SCHILY_SPARSE_REALSIZE;
				}
				return (err);
			}
			/* TODO: Is there a SCHILY.sparse.size similar to GNU.sparse.size ? */
			else if (key_length > 6 && memcmp(key, "xattr.", 6) == 0) {
				key_length -= 6;
				key += 6;
				if (value_length < xattr_limit) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading SCHILY.xattr");
						return (ARCHIVE_FATAL);
					}
					if (pax_attribute_SCHILY_xattr(entry, key, key_length, p, value_length)) {
						/* TODO: Unable to parse xattr */
						err = ARCHIVE_WARN;
					}
				} else {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Unreasonably large xattr: %d > %d",
							  (int)value_length, (int)xattr_limit);
					err = ARCHIVE_WARN;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
		}
		/* SUN.* extensions from Solaris tar */
		if (key_length > 4 && memcmp(key, "SUN.", 4) == 0) {
			key_length -= 4;
			key += 4;

			if (key_length == 9 && memcmp(key, "holesdata", 9) == 0) {
				/* SUN.holesdata */
				if (value_length < sparse_map_limit) {
					p = __archive_read_ahead(a, value_length, &bytes_read);
					if (p == NULL) {
						archive_set_error(&a->archive, EINVAL,
								  "Truncated archive"
								  " detected while reading SUN.holesdata");
						return (ARCHIVE_FATAL);
					}
					err = pax_attribute_SUN_holesdata(a, tar, entry, p, value_length);
					if (err < ARCHIVE_OK) {
						archive_set_error(&a->archive,
								  ARCHIVE_ERRNO_MISC,
								  "Parse error: SUN.holesdata");
					}
				} else {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Unreasonably large sparse map: %d > %d",
							  (int)value_length, (int)sparse_map_limit);
					err = ARCHIVE_FAILED;
				}
				__archive_read_consume(a, value_length);
				return (err);
			}
		}
		break;
	case 'a':
		if (key_length == 5 && memcmp(key, "atime", 5) == 0) {
			if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
				archive_entry_set_atime(entry, t, n);
			}
			return (err);
		}
		break;
	case 'c':
		if (key_length == 5 && memcmp(key, "ctime", 5) == 0) {
			if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
				archive_entry_set_ctime(entry, t, n);
			}
			return (err);
		} else if (key_length == 7 && memcmp(key, "charset", 7) == 0) {
			/* TODO: Publish charset information in entry. */
		} else if (key_length == 7 && memcmp(key, "comment", 7) == 0) {
			/* TODO: Publish comment in entry. */
		}
		break;
	case 'g':
		if (key_length == 3 && memcmp(key, "gid", 3) == 0) {
			if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
				archive_entry_set_gid(entry, t);
			}
			return (err);
		} else if (key_length == 5 && memcmp(key, "gname", 5) == 0) {
			if (value_length > guname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &(tar->entry_gname), value_length, unconsumed);
			}
			return (err);
		}
		break;
	case 'h':
		if (key_length == 10 && memcmp(key, "hdrcharset", 10) == 0) {
			if (value_length < 64) {
				p = __archive_read_ahead(a, value_length, &bytes_read);
				if (p == NULL) {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
							  "Truncated tar archive "
							  "detected while reading hdrcharset attribute");
					return (ARCHIVE_FATAL);
				}
				if (value_length == 6
				    && memcmp(p, "BINARY", 6) == 0) {
					/* Binary  mode. */
					tar->pax_hdrcharset_utf8 = 0;
					err = ARCHIVE_OK;
				} else if (value_length == 23
					   && memcmp(p, "ISO-IR 10646 2000 UTF-8", 23) == 0) {
					tar->pax_hdrcharset_utf8 = 1;
					err = ARCHIVE_OK;
				} else {
					/* TODO: Unrecognized character set */
					err  = ARCHIVE_WARN;
				}
			} else {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
						  "hdrcharset attribute is unreasonably large (%d bytes)",
						  (int)value_length);
				err = ARCHIVE_WARN;
			}
			__archive_read_consume(a, value_length);
			return (err);
		}
		break;
	case 'l':
		/* pax interchange doesn't distinguish hardlink vs. symlink. */
		if (key_length == 8 && memcmp(key, "linkpath", 8) == 0) {
			if (value_length > pathname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &tar->entry_linkpath, value_length, unconsumed);
			}
			return (err);
		}
		break;
	case 'm':
		if (key_length == 5 && memcmp(key, "mtime", 5) == 0) {
			if ((err = pax_attribute_read_time(a, value_length, &t, &n, unconsumed)) == ARCHIVE_OK) {
				archive_entry_set_mtime(entry, t, n);
			}
			return (err);
		}
		break;
	case 'p':
		if (key_length == 4 && memcmp(key, "path", 4) == 0) {
			if (value_length > pathname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &(tar->entry_pathname), value_length, unconsumed);
			}
			return (err);
		}
		break;
	case 'r':
		/* POSIX has reserved 'realtime.*' */
		break;
	case 's':
		/* POSIX has reserved 'security.*' */
		/* Someday: if (strcmp(key, "security.acl") == 0) { ... } */
		if (key_length == 4 && memcmp(key, "size", 4) == 0) {
			/* "size" is the size of the data in the entry. */
			if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
				tar->pax_size = t;
				tar->size_fields |= TAR_SIZE_PAX_SIZE;
			}
			else if (t == INT64_MAX) {
				/* Note: pax_attr_read_number returns INT64_MAX on overflow or < 0 */
				tar->entry_bytes_remaining = 0;
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Tar size attribute overflow");
				return (ARCHIVE_FATAL);
			}
			return (err);
		}
		break;
	case 'u':
		if (key_length == 3 && memcmp(key, "uid", 3) == 0) {
			if ((err = pax_attribute_read_number(a, value_length, &t)) == ARCHIVE_OK) {
				archive_entry_set_uid(entry, t);
			}
			return (err);
		} else if (key_length == 5 && memcmp(key, "uname", 5) == 0) {
			if (value_length > guname_limit) {
				*unconsumed += value_length;
				err = ARCHIVE_WARN;
			} else {
				err = read_bytes_to_string(a, &(tar->entry_uname), value_length, unconsumed);
			}
			return (err);
		}
		break;
	}

	/* Unrecognized key, just skip the entire value. */
	__archive_read_consume(a, value_length);
	return (err);
}